

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O2

OPJ_OFF_T opj_stream_write_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_BOOL OVar1;
  OPJ_OFF_T OVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  if ((p_stream->m_status & 8) == 0) {
    OVar1 = opj_stream_flush(p_stream,p_event_mgr);
    if (OVar1 == 0) {
      *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 8;
      p_stream->m_bytes_in_buffer = 0;
    }
    else {
      uVar3 = 0;
      for (; 0 < p_size; p_size = p_size - OVar2) {
        OVar2 = (*p_stream->m_skip_fn)(p_size,p_stream->m_user_data);
        if (OVar2 == -1) {
          opj_event_msg(p_event_mgr,4,"Stream error!\n");
          *(byte *)&p_stream->m_status = (byte)p_stream->m_status | 8;
          p_stream->m_byte_offset = p_stream->m_byte_offset + uVar3;
          return uVar3 | -(ulong)(uVar3 == 0);
        }
        uVar3 = uVar3 + OVar2;
      }
      p_stream->m_byte_offset = p_stream->m_byte_offset + uVar3;
    }
  }
  return uVar3;
}

Assistant:

OPJ_OFF_T opj_stream_write_skip (opj_stream_private_t * p_stream, OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
	OPJ_BOOL l_is_written = 0;
	OPJ_OFF_T l_current_skip_nb_bytes = 0;
	OPJ_OFF_T l_skip_nb_bytes = 0;

	if (p_stream->m_status & OPJ_STREAM_STATUS_ERROR) {
		return (OPJ_OFF_T) -1;
	}

	/* we should flush data */
	l_is_written = opj_stream_flush (p_stream, p_event_mgr);
	if (! l_is_written) {
		p_stream->m_status |= OPJ_STREAM_STATUS_ERROR;
		p_stream->m_bytes_in_buffer = 0;
		return (OPJ_OFF_T) -1;
	}
	/* then skip */

	while (p_size > 0) {
		/* we should do an actual skip on the media */
		l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
		
		if (l_current_skip_nb_bytes == (OPJ_OFF_T)-1) {
			opj_event_msg(p_event_mgr, EVT_INFO, "Stream error!\n");

			p_stream->m_status |= OPJ_STREAM_STATUS_ERROR;
			p_stream->m_byte_offset += l_skip_nb_bytes;
			/* end if stream */
			return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T)-1;
		}
		p_size -= l_current_skip_nb_bytes;
		l_skip_nb_bytes += l_current_skip_nb_bytes;
	}

	p_stream->m_byte_offset += l_skip_nb_bytes;
	
	return l_skip_nb_bytes;
}